

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
PaysMoreThanConflicts_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,setEntries *iters_conflicting,CFeeRate replacement_feerate,
          uint256 *txid)

{
  uint32_t num_bytes;
  _Rb_tree_node_base *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  CFeeRate original_feerate;
  FeeEstimateMode local_d0 [2];
  CFeeRate local_c8;
  CFeeRate local_c0;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = (iters_conflicting->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0.nSatoshisPerK = replacement_feerate.nSatoshisPerK;
  do {
    if ((_Rb_tree_header *)p_Var1 == &(iters_conflicting->_M_t)._M_impl.super__Rb_tree_header) {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
LAB_007c5c5d:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    local_58._M_dataplus._M_p = (pointer)(*(CTxMemPoolEntry **)(p_Var1 + 1))->m_modified_fee;
    num_bytes = CTxMemPoolEntry::GetTxSize(*(CTxMemPoolEntry **)(p_Var1 + 1));
    CFeeRate::CFeeRate(&local_c8,(CAmount *)&local_58,num_bytes);
    if (replacement_feerate.nSatoshisPerK <= local_c8.nSatoshisPerK) {
      base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)txid);
      local_d0[1] = 3;
      CFeeRate::ToString_abi_cxx11_(&local_98,&local_c0,local_d0 + 1);
      local_d0[0] = BTC_KVB;
      CFeeRate::ToString_abi_cxx11_(&local_b8,&local_c8,local_d0);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (&local_58,
                 (tinyformat *)"rejecting replacement %s; new feerate %s <= old feerate %s",
                 (char *)&local_78,&local_98,&local_b8,in_R9);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      goto LAB_007c5c5d;
    }
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  } while( true );
}

Assistant:

std::optional<std::string> PaysMoreThanConflicts(const CTxMemPool::setEntries& iters_conflicting,
                                                 CFeeRate replacement_feerate,
                                                 const uint256& txid)
{
    for (const auto& mi : iters_conflicting) {
        // Don't allow the replacement to reduce the feerate of the mempool.
        //
        // We usually don't want to accept replacements with lower feerates than what they replaced
        // as that would lower the feerate of the next block. Requiring that the feerate always be
        // increased is also an easy-to-reason about way to prevent DoS attacks via replacements.
        //
        // We only consider the feerates of transactions being directly replaced, not their indirect
        // descendants. While that does mean high feerate children are ignored when deciding whether
        // or not to replace, we do require the replacement to pay more overall fees too, mitigating
        // most cases.
        CFeeRate original_feerate(mi->GetModifiedFee(), mi->GetTxSize());
        if (replacement_feerate <= original_feerate) {
            return strprintf("rejecting replacement %s; new feerate %s <= old feerate %s",
                             txid.ToString(),
                             replacement_feerate.ToString(),
                             original_feerate.ToString());
        }
    }
    return std::nullopt;
}